

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindFileContainingExtension
          (EncodedDescriptorDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  DescriptorIndex *this_00;
  StringPiece containing_type_00;
  bool bVar1;
  pair<const_void_*,_int> pVar2;
  
  this_00 = (this->index_)._M_t.
            super___uniq_ptr_impl<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
            .
            super__Head_base<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_false>
            ._M_head_impl;
  containing_type_00.ptr_ = (containing_type->_M_dataplus)._M_p;
  containing_type_00.length_ = containing_type->_M_string_length;
  if ((long)containing_type->_M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (containing_type->_M_string_length,"string length exceeds max size");
  }
  pVar2 = DescriptorIndex::FindExtension(this_00,containing_type_00,field_number);
  if (pVar2.first != (void *)0x0) {
    bVar1 = MessageLite::ParseFromArray((MessageLite *)output,pVar2.first,pVar2.second);
    return bVar1;
  }
  return false;
}

Assistant:

bool EncodedDescriptorDatabase::FindFileContainingExtension(
    const std::string& containing_type, int field_number,
    FileDescriptorProto* output) {
  return MaybeParse(index_->FindExtension(containing_type, field_number),
                    output);
}